

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport_amqp_messenger.c
# Opt level: O0

int amqp_messenger_unsubscribe_for_messages(AMQP_MESSENGER_HANDLE messenger_handle)

{
  LOGGER_LOG p_Var1;
  AMQP_MESSENGER_INSTANCE_conflict *instance;
  LOGGER_LOG l;
  int result;
  AMQP_MESSENGER_HANDLE messenger_handle_local;
  
  if (messenger_handle == (AMQP_MESSENGER_HANDLE)0x0) {
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_messenger.c"
                ,"amqp_messenger_unsubscribe_for_messages",0x40d,1,
                "Invalid argument (messenger_handle is NULL)");
    }
    l._4_4_ = 0x40e;
  }
  else {
    messenger_handle->receive_messages = false;
    messenger_handle->on_message_received_callback = (ON_AMQP_MESSENGER_MESSAGE_RECEIVED)0x0;
    messenger_handle->on_message_received_context = (void *)0x0;
    l._4_4_ = 0;
  }
  return l._4_4_;
}

Assistant:

int amqp_messenger_unsubscribe_for_messages(AMQP_MESSENGER_HANDLE messenger_handle)
{
    int result;

    if (messenger_handle == NULL)
    {
        LogError("Invalid argument (messenger_handle is NULL)");
        result = MU_FAILURE;
    }
    else
    {
        AMQP_MESSENGER_INSTANCE* instance = (AMQP_MESSENGER_INSTANCE*)messenger_handle;

        instance->receive_messages = false;
        instance->on_message_received_callback = NULL;
        instance->on_message_received_context = NULL;

        result = RESULT_OK;
    }

    return result;
}